

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QRegularExpression>::relocate
          (QArrayDataPointer<QRegularExpression> *this,qsizetype offset,QRegularExpression **data)

{
  bool bVar1;
  QRegularExpression *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QRegularExpression *res;
  
  first = (QRegularExpression *)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QRegularExpression,long_long>
            (first,in_RDI,(QRegularExpression *)0x29c937);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QRegularExpression>,QRegularExpression_const*>
                        (data,(QArrayDataPointer<QRegularExpression> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(QRegularExpression **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }